

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O2

void luaU_header(char *h)

{
  builtin_strncpy(h,"\x1bLuaQ",6);
  builtin_strncpy(h + 6,"\x01\x04\b\x04\b",6);
  return;
}

Assistant:

void luaU_header (char* h)
{
 int x=1;
 memcpy(h,LUA_SIGNATURE,sizeof(LUA_SIGNATURE)-1);
 h+=sizeof(LUA_SIGNATURE)-1;
 *h++=(char)LUAC_VERSION;
 *h++=(char)LUAC_FORMAT;
 *h++=(char)*(char*)&x;				/* endianness */
 *h++=(char)sizeof(int);
 *h++=(char)sizeof(size_t);
 *h++=(char)sizeof(Instruction);
 *h++=(char)sizeof(lua_Number);
 *h++=(char)(((lua_Number)0.5)==0);		/* is lua_Number integral? */
}